

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::setOptionValue(Highs *this,string *option,string *value)

{
  OptionStatus OVar1;
  string *in_RDX;
  long in_RDI;
  HighsLogOptions report_log_options;
  string *in_stack_000000e8;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_stack_000000f0;
  HighsLogOptions *in_stack_000000f8;
  string *in_stack_00000100;
  HighsLogOptions *in_stack_00000108;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  string local_a0 [104];
  Highs *in_stack_ffffffffffffffc8;
  HighsStatus local_4;
  
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)(in_RDI + 0xe28),
             (HighsLogOptions *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::__cxx11::string::string(local_a0,in_RDX);
  OVar1 = setLocalOptionValue(in_stack_00000108,in_stack_00000100,in_stack_000000f8,
                              in_stack_000000f0,in_stack_000000e8);
  std::__cxx11::string::~string(local_a0);
  if (OVar1 == kOk) {
    local_4 = optionChangeAction(in_stack_ffffffffffffffc8);
  }
  else {
    local_4 = kError;
  }
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x483be4);
  return local_4;
}

Assistant:

HighsStatus Highs::setOptionValue(const std::string& option,
                                  const std::string& value) {
  HighsLogOptions report_log_options = options_.log_options;
  if (setLocalOptionValue(report_log_options, option, options_.log_options,
                          options_.records, value) == OptionStatus::kOk)
    return optionChangeAction();
  return HighsStatus::kError;
}